

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

DefinitionLookupResult * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,string_view lookupName,Scope *scope,ConfigRule *configRule,
          SourceRange sourceRange,DiagCode code)

{
  SourceRange range;
  SourceRange sourceRange_00;
  bool bVar1;
  uint n_;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *pvVar2;
  size_t sVar3;
  group_type *pgVar4;
  value_type *pvVar5;
  Diagnostic *pDVar6;
  size_t in_RCX;
  SourceLocation in_RDX;
  long in_RSI;
  DefinitionLookupResult *in_RDI;
  SourceLocation in_R8;
  Diagnostic *in_R9;
  string_view sVar7;
  Diagnostic *diag;
  const_iterator it;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> result;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd18;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
  *in_stack_fffffffffffffd20;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffd28;
  Diagnostic *in_stack_fffffffffffffd38;
  SourceLocation in_stack_fffffffffffffd40;
  SourceLocation in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  DiagCode noteCode;
  DefinitionLookupResult *this_00;
  pointer local_208;
  Scope *in_stack_fffffffffffffe00;
  Compilation *in_stack_fffffffffffffe08;
  SourceLocation in_stack_fffffffffffffe10;
  SourceLocation in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  Symbol *in_stack_fffffffffffffe28;
  DiagCode in_stack_fffffffffffffe40;
  ConfigBlockSymbol *in_stack_fffffffffffffe60;
  ConfigRule *in_stack_fffffffffffffe68;
  Compilation *in_stack_fffffffffffffe70;
  undefined1 local_170 [48];
  ConfigBlockSymbol *local_140;
  SourceLocation local_138;
  byte local_130;
  Diagnostic *local_128;
  SourceLocation local_120;
  SourceLocation local_110;
  size_t sStack_108;
  ConfigRule *local_100;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  ConfigRule *local_d0;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
  local_b0;
  ConfigRule *local_98;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_90;
  iterator local_88;
  size_t local_78;
  ConfigRule *pCVar8;
  ConfigRule *rule;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *defList;
  uint local_44;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  ConfigRule *local_10;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *local_8;
  
  this_00 = in_RDI;
  local_128 = in_R9;
  local_120 = in_R8;
  local_110 = in_RDX;
  sStack_108 = in_RCX;
  std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>::
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool,_true>
            ((pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *)
             in_stack_fffffffffffffd20);
  pvVar2 = (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)(in_RSI + 0x238);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::get
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             in_stack_fffffffffffffd20);
  std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>::
  tuple<std::basic_string_view<char,_std::char_traits<char>_>_&,_slang::ast::RootSymbol_*,_true>
            ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(RootSymbol **)0x7bdbab);
  local_100 = (ConfigRule *)local_170;
  local_f8 = pvVar2;
  local_d0 = local_100;
  local_c8 = pvVar2;
  local_98 = local_100;
  local_90 = pvVar2;
  pCVar8 = local_100;
  defList = pvVar2;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
             ::
             hash_for<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                       (in_stack_fffffffffffffd20,
                        (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         *)in_stack_fffffffffffffd18);
  rule = pCVar8;
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
             ::position_for(in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18);
  local_20 = local_78;
  local_10 = pCVar8;
  local_8 = pvVar2;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    sVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    pgVar4 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
             ::groups((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                       *)0x7bdceb);
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match(in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    if (local_44 != 0) {
      pvVar5 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
               ::elements((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                           *)0x7bdd39);
      do {
        n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                *)0x7bdd8c);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
        ::
        key_from<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>
                  ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                    *)0x7bddb9);
        bVar1 = std::
                equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                ::operator()((equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                              *)in_stack_fffffffffffffd20,
                             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              *)in_stack_fffffffffffffd18,
                             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              *)0x7bddcb);
        noteCode = SUB84((ulong)in_stack_fffffffffffffd50 >> 0x20,0);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
          ::table_locator(&local_b0,pgVar4 + sVar3,n_,pvVar5 + sVar3 * 0xf + (ulong)n_);
          goto LAB_007bdeb0;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18);
    noteCode = SUB84((ulong)in_stack_fffffffffffffd50 >> 0x20,0);
    if (bVar1) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,*(size_t *)(in_RSI + 0x240));
    noteCode = SUB84((ulong)in_stack_fffffffffffffd50 >> 0x20,0);
    if (!bVar1) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
      ::table_locator(&local_b0);
LAB_007bdeb0:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                 ::make_iterator((locator *)0x7bdebd);
      local_e0.pc_ = local_88.pc_;
      local_e0.p_ = local_88.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      local_f0 = local_c0.pc_;
      local_e8 = local_c0.p_;
      local_170._24_8_ = local_c0.pc_;
      local_170._32_8_ = local_c0.p_;
      sVar7 = (string_view)
              boost::unordered::
              unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
              ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                     *)0x7bdf53);
      bVar1 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffd20,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffd18);
      if (bVar1) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)0x7bdfc8);
        noteCode = SUB84((ulong)local_128 >> 0x20,0);
        resolveConfigRules(in_stack_fffffffffffffe70,sVar7,(Scope *)in_stack_fffffffffffffe68,
                           (ResolvedConfig *)in_stack_fffffffffffffe60,rule,defList);
        std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>::operator=
                  ((pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *)(local_170 + 0x28)
                   ,(type)&stack0xfffffffffffffe58);
        in_stack_fffffffffffffd48 = local_120;
      }
      else {
        local_208 = (pointer)0x0;
        in_stack_fffffffffffffe00 = (Scope *)0x0;
        in_stack_fffffffffffffe08 = (Compilation *)0x0;
        pvVar2 = (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)&local_208;
        std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::vector
                  ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)0x7be071);
        resolveConfigRules(in_stack_fffffffffffffe70,sVar7,(Scope *)in_stack_fffffffffffffe68,
                           (ResolvedConfig *)in_stack_fffffffffffffe60,rule,defList);
        std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>::operator=
                  ((pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *)(local_170 + 0x28)
                   ,(type)&stack0xfffffffffffffe28);
        std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::~vector(pvVar2);
        in_stack_fffffffffffffd38 = local_128;
        in_stack_fffffffffffffd40 = local_120;
        in_stack_fffffffffffffe18 = local_110;
        in_stack_fffffffffffffe20 = sStack_108;
      }
      if ((((Symbol *)local_170._40_8_ == (Symbol *)0x0) && ((local_130 & 1) == 0)) &&
         (sVar7._M_str = (char *)in_stack_fffffffffffffe28, sVar7._M_len = in_stack_fffffffffffffe20
         , sourceRange_00.endLoc = in_stack_fffffffffffffe18,
         sourceRange_00.startLoc = in_stack_fffffffffffffe10,
         pDVar6 = errorMissingDef(in_stack_fffffffffffffe08,sVar7,in_stack_fffffffffffffe00,
                                  sourceRange_00,in_stack_fffffffffffffe40),
         pDVar6 != (Diagnostic *)0x0)) {
        not_null<const_slang::syntax::SyntaxNode_*>::operator->
                  ((not_null<const_slang::syntax::SyntaxNode_*> *)0x7be1de);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        range.endLoc = in_stack_fffffffffffffd48;
        range.startLoc = in_stack_fffffffffffffd40;
        Diagnostic::addNote(in_stack_fffffffffffffd38,noteCode,range);
      }
      in_RDI->definition = (Symbol *)local_170._40_8_;
      in_RDI->configRoot = local_140;
      in_RDI->configRule = (ConfigRule *)local_138;
      return this_00;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
  ::table_locator(&local_b0);
  goto LAB_007bdeb0;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::getDefinition(std::string_view lookupName,
                                                               const Scope& scope,
                                                               const ConfigRule& configRule,
                                                               SourceRange sourceRange,
                                                               DiagCode code) const {
    std::pair<DefinitionLookupResult, bool> result;
    if (auto it = definitionMap.find({lookupName, root.get()}); it != definitionMap.end())
        result = resolveConfigRules(lookupName, scope, nullptr, &configRule, it->second.first);
    else
        result = resolveConfigRules(lookupName, scope, nullptr, &configRule, {});

    if (!result.first.definition && !result.second) {
        // No definition found and no error issued, so issue one ourselves.
        auto diag = errorMissingDef(lookupName, scope, sourceRange, code);
        if (diag)
            diag->addNote(diag::NoteConfigRule, configRule.syntax->sourceRange());
    }

    return result.first;
}